

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImTriangleBarycentricCoords
               (ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p,float *out_u,float *out_v,float *out_w)

{
  float fVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  undefined4 uStack_50;
  float denom;
  ImVec2 v2;
  ImVec2 v1;
  ImVec2 v0;
  float *out_v_local;
  float *out_u_local;
  ImVec2 *p_local;
  ImVec2 *c_local;
  ImVec2 *b_local;
  ImVec2 *a_local;
  
  IVar2 = operator-(b,a);
  IVar3 = operator-(c,a);
  IVar4 = operator-(p,a);
  v1.x = IVar2.x;
  v2.y = IVar3.y;
  v2.x = IVar3.x;
  v1.y = IVar2.y;
  fVar1 = v1.x * v2.y + -(v2.x * v1.y);
  uStack_50 = IVar4.x;
  denom = IVar4.y;
  *out_v = (uStack_50 * v2.y + -(v2.x * denom)) / fVar1;
  *out_w = (v1.x * denom + -(uStack_50 * v1.y)) / fVar1;
  *out_u = (1.0 - *out_v) - *out_w;
  return;
}

Assistant:

void ImTriangleBarycentricCoords(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& p, float& out_u, float& out_v, float& out_w)
{
    ImVec2 v0 = b - a;
    ImVec2 v1 = c - a;
    ImVec2 v2 = p - a;
    const float denom = v0.x * v1.y - v1.x * v0.y;
    out_v = (v2.x * v1.y - v1.x * v2.y) / denom;
    out_w = (v0.x * v2.y - v2.x * v0.y) / denom;
    out_u = 1.0f - out_v - out_w;
}